

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_e93b21::PathSimplifier::Element::flip(Element *this)

{
  uint uVar1;
  quint32 qVar2;
  long lVar3;
  int i;
  ulong uVar4;
  long lVar5;
  
  lVar3 = 0;
  for (uVar4 = 0; uVar1 = *(uint *)&this->field_0x38, uVar4 < (uVar1 & 0xff) + 1 >> 1;
      uVar4 = uVar4 + 1) {
    lVar5 = (ulong)(uVar1 & 0xff) + lVar3;
    qVar2 = this->indices[uVar4];
    this->indices[uVar4] = this->indices[lVar5];
    this->indices[lVar5] = qVar2;
    lVar3 = lVar3 + -1;
  }
  *(ushort *)&this->field_0x38 = (ushort)uVar1 ^ 0x200;
  return;
}

Assistant:

inline void PathSimplifier::Element::flip()
{
    for (int i = 0; i < (degree + 1) >> 1; ++i) {
        Q_ASSERT(degree >= Line && degree <= Cubic);
        Q_ASSERT(i >= 0 && i < degree);
        qSwap(indices[i], indices[degree - i]);
    }
    pointingUp = !pointingUp;
    Q_ASSERT(next == nullptr && previous == nullptr);
}